

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RateLimiterTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::utils::RateLimiter_testRateLimiter_Test::TestBody
          (RateLimiter_testRateLimiter_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult local_3d8 [2];
  AssertHelper local_3b8 [8];
  Message local_3b0 [15];
  bool local_3a1;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_370 [8];
  Message local_368 [15];
  bool local_359;
  undefined1 local_358 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_328 [8];
  Message local_320 [15];
  bool local_311;
  undefined1 local_310 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_2e0 [8];
  Message local_2d8 [15];
  bool local_2c9;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_298 [8];
  Message local_290 [15];
  bool local_281;
  undefined1 local_280 [8];
  AssertionResult gtest_ar__6;
  duration<long,std::ratio<1l,1l>> local_268 [8];
  duration local_260;
  AssertionResult local_258 [2];
  AssertHelper local_238 [8];
  Message local_230 [15];
  bool local_221;
  undefined1 local_220 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1f0 [8];
  Message local_1e8 [15];
  bool local_1d9;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar__4;
  duration<long,std::ratio<1l,1000l>> local_1c0 [8];
  duration local_1b8;
  AssertionResult local_1b0 [2];
  AssertHelper local_190 [8];
  Message local_188 [15];
  bool local_179;
  undefined1 local_178 [8];
  AssertionResult gtest_ar__3;
  duration<long,std::ratio<1l,1000l>> local_160 [8];
  duration local_158;
  AssertionResult local_150 [2];
  AssertHelper local_130 [8];
  Message local_128 [15];
  bool local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_e8 [8];
  Message local_e0 [15];
  bool local_d1;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__1;
  AssertionResult local_b8 [2];
  AssertHelper local_98 [8];
  Message local_90 [31];
  bool local_71;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock> limiter;
  time_point timestamp;
  RateLimiter_testRateLimiter_Test *this_local;
  
  (anonymous_namespace)::currentTime.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  limiter._mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)(anonymous_namespace)::currentTime.__d.__r;
  RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::RateLimiter
            ((RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock> *)
             &gtest_ar_.message_,2.0,2.0);
  local_71 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                       ((RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock> *)
                        &gtest_ar_.message_,1.0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_70,&local_71,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_b8,local_70,"limiter.checkCredit(1)","false");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=(local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(local_98);
    std::__cxx11::string::~string((string *)local_b8);
    testing::Message::~Message(local_90);
  }
  gtest_ar__1.message_.ptr_._5_3_ = 0;
  gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
    local_d1 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                         ((RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock> *)
                          &gtest_ar_.message_,1.0);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_d0,&local_d1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
    if (!bVar1) {
      testing::Message::Message(local_e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)&gtest_ar__2.message_,local_d0,"limiter.checkCredit(1)","false")
      ;
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (local_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                 ,0x30,pcVar2);
      testing::internal::AssertHelper::operator=(local_e8,local_e0);
      testing::internal::AssertHelper::~AssertHelper(local_e8);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(local_e0);
    }
    gtest_ar__1.message_.ptr_._5_3_ = 0;
    gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
      local_119 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                            ((RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock> *)
                             &gtest_ar_.message_,1.0);
      local_119 = !local_119;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_118,&local_119,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
      if (!bVar1) {
        testing::Message::Message(local_128);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (local_150,local_118,"limiter.checkCredit(1)","true");
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (local_130,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                   ,0x31,pcVar2);
        testing::internal::AssertHelper::operator=(local_130,local_128);
        testing::internal::AssertHelper::~AssertHelper(local_130);
        std::__cxx11::string::~string((string *)local_150);
        testing::Message::~Message(local_128);
      }
      gtest_ar__1.message_.ptr_._5_3_ = 0;
      gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
      if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
        gtest_ar__3.message_.ptr_._4_4_ = 0xfa;
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                  (local_160,(int *)((long)&gtest_ar__3.message_.ptr_ + 4));
        (anonymous_namespace)::currentTime =
             std::chrono::operator+
                       ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)&limiter._mutex.super___mutex_base._M_mutex.__data.__list.__next,
                        (duration<long,_std::ratio<1L,_1000L>_> *)local_160);
        local_158 = (anonymous_namespace)::currentTime.__d.__r;
        local_179 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                              ((RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>
                                *)&gtest_ar_.message_,1.0);
        local_179 = !local_179;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_178,&local_179,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
        if (!bVar1) {
          testing::Message::Message(local_188);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (local_1b0,local_178,"limiter.checkCredit(1)","true");
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (local_190,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                     ,0x34,pcVar2);
          testing::internal::AssertHelper::operator=(local_190,local_188);
          testing::internal::AssertHelper::~AssertHelper(local_190);
          std::__cxx11::string::~string((string *)local_1b0);
          testing::Message::~Message(local_188);
        }
        gtest_ar__1.message_.ptr_._5_3_ = 0;
        gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
        if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
          gtest_ar__4.message_.ptr_._4_4_ = 0x2ee;
          std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                    (local_1c0,(int *)((long)&gtest_ar__4.message_.ptr_ + 4));
          (anonymous_namespace)::currentTime =
               std::chrono::operator+
                         ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)&limiter._mutex.super___mutex_base._M_mutex.__data.__list.__next,
                          (duration<long,_std::ratio<1L,_1000L>_> *)local_1c0);
          local_1b8 = (anonymous_namespace)::currentTime.__d.__r;
          local_1d9 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::
                      checkCredit((RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>
                                   *)&gtest_ar_.message_,1.0);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_1d8,&local_1d9,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
          if (!bVar1) {
            testing::Message::Message(local_1e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((AssertionResult *)&gtest_ar__5.message_,local_1d8,"limiter.checkCredit(1)",
                       "false");
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (local_1f0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                       ,0x37,pcVar2);
            testing::internal::AssertHelper::operator=(local_1f0,local_1e8);
            testing::internal::AssertHelper::~AssertHelper(local_1f0);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(local_1e8);
          }
          gtest_ar__1.message_.ptr_._5_3_ = 0;
          gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
          if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
            local_221 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::
                        checkCredit((RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>
                                     *)&gtest_ar_.message_,1.0);
            local_221 = !local_221;
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_220,&local_221,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
            if (!bVar1) {
              testing::Message::Message(local_230);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (local_258,local_220,"limiter.checkCredit(1)","true");
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (local_238,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                         ,0x38,pcVar2);
              testing::internal::AssertHelper::operator=(local_238,local_230);
              testing::internal::AssertHelper::~AssertHelper(local_238);
              std::__cxx11::string::~string((string *)local_258);
              testing::Message::~Message(local_230);
            }
            gtest_ar__1.message_.ptr_._5_3_ = 0;
            gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
            if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
              gtest_ar__6.message_.ptr_._4_4_ = 5;
              std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                        (local_268,(int *)((long)&gtest_ar__6.message_.ptr_ + 4));
              (anonymous_namespace)::currentTime =
                   std::chrono::operator+
                             ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)&limiter._mutex.super___mutex_base._M_mutex.__data.__list.__next,
                              (duration<long,_std::ratio<1L,_1L>_> *)local_268);
              local_260 = (anonymous_namespace)::currentTime.__d.__r;
              local_281 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::
                          checkCredit((RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>
                                       *)&gtest_ar_.message_,1.0);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_280,&local_281,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
              if (!bVar1) {
                testing::Message::Message(local_290);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((AssertionResult *)&gtest_ar__7.message_,local_280,
                           "limiter.checkCredit(1)","false");
                pcVar2 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (local_298,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                           ,0x3b,pcVar2);
                testing::internal::AssertHelper::operator=(local_298,local_290);
                testing::internal::AssertHelper::~AssertHelper(local_298);
                std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                testing::Message::~Message(local_290);
              }
              gtest_ar__1.message_.ptr_._5_3_ = 0;
              gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
              if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                local_2c9 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::
                            checkCredit((RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>
                                         *)&gtest_ar_.message_,1.0);
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_2c8,&local_2c9,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_2c8);
                if (!bVar1) {
                  testing::Message::Message(local_2d8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((AssertionResult *)&gtest_ar__8.message_,local_2c8,
                             "limiter.checkCredit(1)","false");
                  pcVar2 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (local_2e0,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                             ,0x3c,pcVar2);
                  testing::internal::AssertHelper::operator=(local_2e0,local_2d8);
                  testing::internal::AssertHelper::~AssertHelper(local_2e0);
                  std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
                  testing::Message::~Message(local_2d8);
                }
                gtest_ar__1.message_.ptr_._5_3_ = 0;
                gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
                if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                  local_311 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::
                              checkCredit((RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>
                                           *)&gtest_ar_.message_,1.0);
                  local_311 = !local_311;
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_310,&local_311,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_310);
                  if (!bVar1) {
                    testing::Message::Message(local_320);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((AssertionResult *)&gtest_ar__9.message_,local_310,
                               "limiter.checkCredit(1)","true");
                    pcVar2 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (local_328,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                               ,0x3d,pcVar2);
                    testing::internal::AssertHelper::operator=(local_328,local_320);
                    testing::internal::AssertHelper::~AssertHelper(local_328);
                    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
                    testing::Message::~Message(local_320);
                  }
                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                  gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                    local_359 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>
                                ::checkCredit((RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>
                                               *)&gtest_ar_.message_,1.0);
                    local_359 = !local_359;
                    testing::AssertionResult::AssertionResult<bool>
                              ((AssertionResult *)local_358,&local_359,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_358);
                    if (!bVar1) {
                      testing::Message::Message(local_368);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((AssertionResult *)&gtest_ar__10.message_,local_358,
                                 "limiter.checkCredit(1)","true");
                      pcVar2 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (local_370,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                                 ,0x3e,pcVar2);
                      testing::internal::AssertHelper::operator=(local_370,local_368);
                      testing::internal::AssertHelper::~AssertHelper(local_370);
                      std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
                      testing::Message::~Message(local_368);
                    }
                    gtest_ar__1.message_.ptr_._5_3_ = 0;
                    gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
                    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                      local_3a1 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>
                                  ::checkCredit((RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>
                                                 *)&gtest_ar_.message_,1.0);
                      local_3a1 = !local_3a1;
                      testing::AssertionResult::AssertionResult<bool>
                                ((AssertionResult *)local_3a0,&local_3a1,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_3a0);
                      if (!bVar1) {
                        testing::Message::Message(local_3b0);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  (local_3d8,local_3a0,"limiter.checkCredit(1)","true");
                        pcVar2 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (local_3b8,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                                   ,0x3f,pcVar2);
                        testing::internal::AssertHelper::operator=(local_3b8,local_3b0);
                        testing::internal::AssertHelper::~AssertHelper(local_3b8);
                        std::__cxx11::string::~string((string *)local_3d8);
                        testing::Message::~Message(local_3b0);
                      }
                      gtest_ar__1.message_.ptr_._5_3_ = 0;
                      gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(RateLimiter, testRateLimiter)
{
    const auto timestamp = std::chrono::steady_clock::now();
    currentTime = timestamp;
    RateLimiter<MockClock> limiter(2, 2);

    ASSERT_TRUE(limiter.checkCredit(1));
    ASSERT_TRUE(limiter.checkCredit(1));
    ASSERT_FALSE(limiter.checkCredit(1));

    currentTime = timestamp + std::chrono::milliseconds(250);
    ASSERT_FALSE(limiter.checkCredit(1));

    currentTime = timestamp + std::chrono::milliseconds(750);
    ASSERT_TRUE(limiter.checkCredit(1));
    ASSERT_FALSE(limiter.checkCredit(1));

    currentTime = timestamp + std::chrono::seconds(5);
    ASSERT_TRUE(limiter.checkCredit(1));
    ASSERT_TRUE(limiter.checkCredit(1));
    ASSERT_FALSE(limiter.checkCredit(1));
    ASSERT_FALSE(limiter.checkCredit(1));
    ASSERT_FALSE(limiter.checkCredit(1));
}